

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,uchar *buf,uchar *end)

{
  ushort uVar1;
  uint16_t uVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  uint16_t *puVar7;
  char *pcVar8;
  int iVar9;
  ushort *puVar10;
  uchar alert_type;
  ushort *puVar11;
  ushort *puVar12;
  int iVar13;
  ushort in;
  bool bVar14;
  
  if (end < buf || (ulong)((long)end - (long)buf) < 2) {
    iVar9 = 0x1738;
LAB_002091b3:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,iVar9,"missing input data in %s","mbedtls_ssl_parse_sig_alg_ext");
  }
  else {
    uVar1 = *(ushort *)buf;
    uVar5 = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
    puVar12 = (ushort *)(buf + 2);
    pmVar3 = ssl->handshake;
    pmVar3->received_sig_algs[8] = 0;
    pmVar3->received_sig_algs[9] = 0;
    pmVar3->received_sig_algs[10] = 0;
    pmVar3->received_sig_algs[0xb] = 0;
    pmVar3->received_sig_algs[0xc] = 0;
    pmVar3->received_sig_algs[0xd] = 0;
    pmVar3->received_sig_algs[0xe] = 0;
    pmVar3->received_sig_algs[0xf] = 0;
    pmVar3->received_sig_algs[0] = 0;
    pmVar3->received_sig_algs[1] = 0;
    pmVar3->received_sig_algs[2] = 0;
    pmVar3->received_sig_algs[3] = 0;
    pmVar3->received_sig_algs[4] = 0;
    pmVar3->received_sig_algs[5] = 0;
    pmVar3->received_sig_algs[6] = 0;
    pmVar3->received_sig_algs[7] = 0;
    pmVar3->received_sig_algs[0x10] = 0;
    pmVar3->received_sig_algs[0x11] = 0;
    pmVar3->received_sig_algs[0x12] = 0;
    pmVar3->received_sig_algs[0x13] = 0;
    if (end < puVar12 || (ulong)((long)end - (long)puVar12) < uVar5) {
      iVar9 = 0x173f;
      goto LAB_002091b3;
    }
    if (uVar1 == 0) {
      uVar4 = 0;
    }
    else {
      puVar10 = (ushort *)(buf + uVar5);
      uVar4 = 0;
      puVar11 = puVar12;
      do {
        while( true ) {
          if ((ulong)((long)puVar10 + (2 - (long)puVar11)) < 2) {
            iVar9 = 0x1742;
            goto LAB_002091b3;
          }
          uVar1 = *puVar11;
          in = uVar1 << 8 | uVar1 >> 8;
          puVar12 = puVar11 + 1;
          pcVar6 = mbedtls_ssl_sig_alg_to_str(in);
          mbedtls_debug_print_msg
                    (ssl,4,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                     ,0x1747,"received signature algorithm: 0x%x %s",(ulong)in,pcVar6);
          if (ssl->tls_version != MBEDTLS_SSL_VERSION_TLS1_2) break;
          if (((char)(uVar1 >> 8) == '\x03') && (0xfd < (byte)((char)uVar1 - 5U))) {
            pmVar3 = ssl->handshake;
            if ((pmVar3 == (mbedtls_ssl_handshake_params *)0x0) ||
               ((pmVar3->sig_algs_heap_allocated != '\x01' ||
                (puVar7 = pmVar3->sig_algs, puVar7 == (uint16_t *)0x0)))) {
              puVar7 = ssl->conf->sig_algs;
            }
            if (puVar7 != (uint16_t *)0x0) {
              uVar2 = *puVar7;
              while (uVar2 != 0) {
                puVar7 = puVar7 + 1;
                if (uVar2 == in) goto LAB_002090e4;
                uVar2 = *puVar7;
              }
            }
          }
          bVar14 = puVar10 <= puVar11;
          puVar11 = puVar12;
          if (bVar14) goto LAB_002091eb;
        }
LAB_002090e4:
        pcVar8 = mbedtls_ssl_sig_alg_to_str(in);
        mbedtls_debug_print_msg
                  (ssl,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1751,"valid signature algorithm: %s",pcVar8,pcVar6);
        if (uVar4 + 1 < 0x14) {
          ssl->handshake->received_sig_algs[uVar4] = in;
          uVar4 = uVar4 + 1;
        }
        bVar14 = puVar11 < puVar10;
        puVar11 = puVar12;
      } while (bVar14);
    }
LAB_002091eb:
    if (puVar12 == (ushort *)end) {
      if (uVar4 != 0) {
        ssl->handshake->received_sig_algs[uVar4] = 0;
        return 0;
      }
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1762,"no signature algorithm in common");
      iVar13 = -0x6e00;
      alert_type = '(';
      iVar9 = -0x6e00;
      goto LAB_002091d0;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x175b,"Signature algorithms extension length misaligned");
  }
  iVar13 = -0x7300;
  alert_type = '2';
  iVar9 = -0x7300;
LAB_002091d0:
  mbedtls_ssl_pend_fatal_alert(ssl,alert_type,iVar9);
  return iVar13;
}

Assistant:

int mbedtls_ssl_parse_sig_alg_ext(mbedtls_ssl_context *ssl,
                                  const unsigned char *buf,
                                  const unsigned char *end)
{
    const unsigned char *p = buf;
    size_t supported_sig_algs_len = 0;
    const unsigned char *supported_sig_algs_end;
    uint16_t sig_alg;
    uint32_t common_idx = 0;

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, 2);
    supported_sig_algs_len = MBEDTLS_GET_UINT16_BE(p, 0);
    p += 2;

    memset(ssl->handshake->received_sig_algs, 0,
           sizeof(ssl->handshake->received_sig_algs));

    MBEDTLS_SSL_CHK_BUF_READ_PTR(p, end, supported_sig_algs_len);
    supported_sig_algs_end = p + supported_sig_algs_len;
    while (p < supported_sig_algs_end) {
        MBEDTLS_SSL_CHK_BUF_READ_PTR(p, supported_sig_algs_end, 2);
        sig_alg = MBEDTLS_GET_UINT16_BE(p, 0);
        p += 2;
        MBEDTLS_SSL_DEBUG_MSG(4, ("received signature algorithm: 0x%x %s",
                                  sig_alg,
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if (ssl->tls_version == MBEDTLS_SSL_VERSION_TLS1_2 &&
            (!(mbedtls_ssl_sig_alg_is_supported(ssl, sig_alg) &&
               mbedtls_ssl_sig_alg_is_offered(ssl, sig_alg)))) {
            continue;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

        MBEDTLS_SSL_DEBUG_MSG(4, ("valid signature algorithm: %s",
                                  mbedtls_ssl_sig_alg_to_str(sig_alg)));

        if (common_idx + 1 < MBEDTLS_RECEIVED_SIG_ALGS_SIZE) {
            ssl->handshake->received_sig_algs[common_idx] = sig_alg;
            common_idx += 1;
        }
    }
    /* Check that we consumed all the message. */
    if (p != end) {
        MBEDTLS_SSL_DEBUG_MSG(1,
                              ("Signature algorithms extension length misaligned"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR,
                                     MBEDTLS_ERR_SSL_DECODE_ERROR);
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    if (common_idx == 0) {
        MBEDTLS_SSL_DEBUG_MSG(3, ("no signature algorithm in common"));
        MBEDTLS_SSL_PEND_FATAL_ALERT(MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE,
                                     MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE);
        return MBEDTLS_ERR_SSL_HANDSHAKE_FAILURE;
    }

    ssl->handshake->received_sig_algs[common_idx] = MBEDTLS_TLS_SIG_NONE;
    return 0;
}